

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O1

void __thiscall re2c::free_list<const_re2c::Code_*>::clear(free_list<const_re2c::Code_*> *this)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  
  this->in_clear = true;
  for (p_Var2 = (this->
                super_set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->
       super_set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
       )._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    puVar1 = *(undefined8 **)(p_Var2 + 1);
    if (puVar1 != (undefined8 *)0x0) {
      if ((long *)puVar1[5] != puVar1 + 7) {
        operator_delete((long *)puVar1[5],puVar1[7] + 1);
      }
      if ((long *)*puVar1 != puVar1 + 2) {
        operator_delete((long *)*puVar1,puVar1[2] + 1);
      }
      operator_delete(puVar1,0x48);
    }
  }
  std::
  _Rb_tree<const_re2c::Code_*,_const_re2c::Code_*,_std::_Identity<const_re2c::Code_*>,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
  ::clear((_Rb_tree<const_re2c::Code_*,_const_re2c::Code_*,_std::_Identity<const_re2c::Code_*>,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
           *)this);
  this->in_clear = false;
  return;
}

Assistant:

void clear()
	{
		in_clear = true;

		for(iterator it = this->begin(); it != this->end(); ++it)
		{
			delete *it;
		}
		std::set<_Ty>::clear();
		
		in_clear = false;
	}